

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O1

bool QTestResult::report3WayResult
               (bool success,char *failureMessage,void *lhs,void *rhs,
               _func_char_ptr_void_ptr *lhsFormatter,_func_char_ptr_void_ptr *rhsFormatter,
               char *lhsExpression,char *rhsExpression,_func_char_ptr_void_ptr *actualOrderFormatter
               ,_func_char_ptr_void_ptr *expectedOrderFormatter,void *actualOrder,
               void *expectedOrder,char *expectedExpression,char *file,int line)

{
  long lVar1;
  undefined1 **ppuVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *val1;
  char *val2;
  char *val1_00;
  char *val2_00;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  undefined7 in_register_00000039;
  void *pvVar9;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  undefined1 **local_1058;
  undefined1 *puStack_1050;
  undefined1 *local_1048;
  undefined1 *puStack_1040;
  char msg [4096];
  
  pvVar9 = (void *)(CONCAT71(in_register_00000039,success) & 0xffffffff);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar8 = msg;
  memset(pcVar8,0xaa,0x1000);
  msg[0] = '\0';
  if (lhsExpression == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0013f766;
    report3WayResult();
LAB_0013f641:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0013f766;
    report3WayResult();
  }
  else {
    pcVar8 = rhsExpression;
    if (rhsExpression == (char *)0x0) goto LAB_0013f641;
    if (expectedExpression != (char *)0x0) {
      local_1048 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_1040 = &DAT_aaaaaaaaaaaaaaaa;
      local_1058 = (undefined1 **)&DAT_aaaaaaaaaaaaaaaa;
      puStack_1050 = &DAT_aaaaaaaaaaaaaaaa;
      local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
      sVar5 = strlen(lhsExpression);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1098,lhsExpression,lhsExpression + sVar5);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1098," <=> ");
      local_1078._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1078._M_dataplus._M_p == paVar7) {
        local_1078.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1078.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
      }
      else {
        local_1078.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_1078._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1078,rhsExpression);
      local_1058 = &local_1048;
      ppuVar2 = (undefined1 **)(pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppuVar2 == paVar7) {
        local_1048 = (undefined1 *)paVar7->_M_allocated_capacity;
        puStack_1040 = *(undefined1 **)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_1048 = (undefined1 *)paVar7->_M_allocated_capacity;
        local_1058 = ppuVar2;
      }
      puStack_1050 = (undefined1 *)pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
        operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
        operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
      }
      iVar4 = QTestLog::verboseLevel();
      if (1 < iVar4) {
        snprintf(msg,0x1000,"%s(%s, %s, %s)","QCOMPARE_3WAY",lhsExpression,rhsExpression,
                 expectedExpression);
        QTestLog::info(msg,file,line);
      }
      if ((char)pvVar9 == '\0') {
        val1 = (*lhsFormatter)(lhs);
        val2 = (*rhsFormatter)(rhs);
        val1_00 = (*actualOrderFormatter)(actualOrder);
        val2_00 = (*expectedOrderFormatter)(expectedOrder);
        pcVar8 = "The result of operator<=>() is not what was expected";
        if (failureMessage != (char *)0x0) {
          pcVar8 = failureMessage;
        }
        formatFailMessage(msg,0x1000,pcVar8,val1,val2,lhsExpression,rhsExpression,ThreeWayCompare);
        sVar5 = strlen(msg);
        formatFailMessage(msg + sVar5,0x1000 - sVar5,"",val1_00,val2_00,(char *)local_1058,
                          expectedExpression,CustomCompare);
        bVar3 = checkStatement(false,msg,file,line);
        if (val2_00 != (char *)0x0) {
          operator_delete__(val2_00);
        }
        if (val1_00 != (char *)0x0) {
          operator_delete__(val1_00);
        }
        if (val2 != (char *)0x0) {
          operator_delete__(val2);
        }
        if (val1 != (char *)0x0) {
          operator_delete__(val1);
        }
      }
      else {
        if (QTest::expectFailMode != 0) {
          snprintf(msg,0x1000,"%s(%s, %s, %s) returned TRUE unexpectedly.","QCOMPARE_3WAY",
                   lhsExpression,rhsExpression,expectedExpression);
        }
        bVar3 = checkStatement(true,msg,file,line);
      }
      if (local_1058 != &local_1048) {
        operator_delete(local_1058,(ulong)(local_1048 + 1));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar3;
      }
      goto LAB_0013f766;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    report3WayResult();
    if (pvVar9 != (void *)0x0) {
      operator_delete__(pvVar9);
    }
    if (lhs != (void *)0x0) {
      operator_delete__(lhs);
    }
    if (pcVar8 != (char *)0x0) {
      operator_delete__(pcVar8);
    }
    if (lhsFormatter != (_func_char_ptr_void_ptr *)0x0) {
      operator_delete__(lhsFormatter);
    }
    if (local_1058 != &local_1048) {
      operator_delete(local_1058,(ulong)(local_1048 + 1));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_0013f766:
  __stack_chk_fail();
}

Assistant:

bool QTestResult::report3WayResult(bool success,
                                   const char *failureMessage,
                                   const void *lhs, const void *rhs,
                                   const char *(*lhsFormatter)(const void*),
                                   const char *(*rhsFormatter)(const void*),
                                   const char *lhsExpression, const char *rhsExpression,
                                   const char *(*actualOrderFormatter)(const void *),
                                   const char *(*expectedOrderFormatter)(const void *),
                                   const void *actualOrder, const void *expectedOrder,
                                   const char *expectedExpression,
                                   const char *file, int line)
{
    char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpression);
    QTEST_ASSERT(rhsExpression);
    QTEST_ASSERT(expectedExpression);
    const char *macroName = macroNameForOp(QTest::ComparisonOperation::ThreeWayCompare);
    const std::string actualExpression = std::string(lhsExpression) + " <=> " + rhsExpression;

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s)",
                      macroName, lhsExpression, rhsExpression, expectedExpression);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s) returned TRUE unexpectedly.",
                          macroName, lhsExpression, rhsExpression, expectedExpression);
        }
        return checkStatement(success, msg, file, line);
    }
    const std::unique_ptr<const char[]> lhsStr{lhsFormatter(lhs)};
    const std::unique_ptr<const char[]> rhsStr{rhsFormatter(rhs)};

    const std::unique_ptr<const char[]> actual{actualOrderFormatter(actualOrder)};
    const std::unique_ptr<const char[]> expected{expectedOrderFormatter(expectedOrder)};

    if (!failureMessage)
        failureMessage = failureMessageForOp(QTest::ComparisonOperation::ThreeWayCompare);

    // Left and Right compared parameters of QCOMPARE_3WAY
    formatFailMessage(msg, maxMsgLen, failureMessage,
                      lhsStr.get(), rhsStr.get(),
                      lhsExpression, rhsExpression,
                      QTest::ComparisonOperation::ThreeWayCompare);

    // Actual and Expected results of comparison
    formatFailMessage(msg + strlen(msg), maxMsgLen - strlen(msg), "",
                      actual.get(), expected.get(),
                      actualExpression.c_str(), expectedExpression,
                      QTest::ComparisonOperation::CustomCompare);

    return checkStatement(success, msg, file, line);
}